

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uint *puVar1;
  size_t __size;
  uchar uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int *__s;
  int *__s_00;
  unsigned_short *puVar17;
  unsigned_short *puVar18;
  int *__s_01;
  unsigned_short *puVar19;
  uchar *puVar20;
  uint *puVar21;
  undefined1 (*frequencies) [16];
  undefined1 (*frequencies_00) [16];
  unsigned_short uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  size_t sVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar71;
  int iVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar84;
  int iVar86;
  int iVar87;
  undefined1 auVar85 [16];
  int iVar88;
  ucvector v;
  uivector bitlen_lld_e;
  uivector bitlen_lld;
  LodePNGBitWriter local_150;
  ulong local_140;
  uivector local_138;
  uivector lz77_encoded;
  HuffmanTree tree_ll;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  Hash hash;
  
  v.data = *out;
  v.size = *outsize;
  local_150.data = &v;
  local_150.bp = 0;
  uVar36 = settings->btype;
  uVar13 = 0x3d;
  if (uVar36 < 3) {
    sVar32 = insize;
    v.allocsize = v.size;
    if (uVar36 != 1) {
      if (uVar36 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar13 = 0;
        }
        else {
          uVar24 = (insize + 0xfffe) / 0xffff;
          uVar34 = 0;
          uVar23 = 0;
          do {
            sVar32 = v.size;
            uVar29 = v.size + 1;
            puVar20 = v.data;
            uVar33 = v.allocsize;
            if (v.allocsize < uVar29) {
              uVar33 = uVar29 * 3 >> 1;
              if (v.allocsize * 2 < uVar29) {
                uVar33 = uVar29;
              }
              puVar20 = (uchar *)realloc(v.data,uVar33);
              if (puVar20 != (uchar *)0x0) goto LAB_0010f2fb;
            }
            else {
LAB_0010f2fb:
              v.allocsize = uVar33;
              v.data = puVar20;
              v.data[sVar32] = uVar34 == uVar24 - 1;
              v.size = uVar29;
            }
            sVar32 = v.size;
            iVar76 = (int)uVar23;
            iVar71 = (int)insize - iVar76;
            if (0xfffe < insize - uVar23) {
              iVar71 = 0xffff;
            }
            uVar29 = v.size + 1;
            puVar20 = v.data;
            uVar33 = v.allocsize;
            if (v.allocsize < uVar29) {
              uVar33 = uVar29 * 3 >> 1;
              if (v.allocsize * 2 < uVar29) {
                uVar33 = uVar29;
              }
              puVar20 = (uchar *)realloc(v.data,uVar33);
              if (puVar20 != (uchar *)0x0) goto LAB_0010f373;
            }
            else {
LAB_0010f373:
              v.allocsize = uVar33;
              v.data = puVar20;
              v.data[sVar32] = (uchar)iVar71;
              v.size = uVar29;
            }
            sVar32 = v.size;
            uVar29 = v.size + 1;
            puVar20 = v.data;
            uVar33 = v.allocsize;
            if (v.allocsize < uVar29) {
              uVar33 = uVar29 * 3 >> 1;
              if (v.allocsize * 2 < uVar29) {
                uVar33 = uVar29;
              }
              puVar20 = (uchar *)realloc(v.data,uVar33);
              if (puVar20 != (uchar *)0x0) goto LAB_0010f3cc;
            }
            else {
LAB_0010f3cc:
              v.allocsize = uVar33;
              v.data = puVar20;
              v.data[sVar32] = (uchar)((uint)iVar71 >> 8);
              v.size = uVar29;
            }
            sVar32 = v.size;
            uVar29 = v.size + 1;
            puVar20 = v.data;
            uVar33 = v.allocsize;
            if (v.allocsize < uVar29) {
              uVar33 = uVar29 * 3 >> 1;
              if (v.allocsize * 2 < uVar29) {
                uVar33 = uVar29;
              }
              puVar20 = (uchar *)realloc(v.data,uVar33);
              if (puVar20 != (uchar *)0x0) goto LAB_0010f42d;
            }
            else {
LAB_0010f42d:
              v.allocsize = uVar33;
              v.data = puVar20;
              v.data[sVar32] = (uchar)(0xffff - iVar71);
              v.size = uVar29;
            }
            sVar32 = v.size;
            uVar29 = v.size + 1;
            puVar20 = v.data;
            uVar33 = v.allocsize;
            if (v.allocsize < uVar29) {
              uVar33 = uVar29 * 3 >> 1;
              if (v.allocsize * 2 < uVar29) {
                uVar33 = uVar29;
              }
              puVar20 = (uchar *)realloc(v.data,uVar33);
              if (puVar20 != (uchar *)0x0) goto LAB_0010f485;
            }
            else {
LAB_0010f485:
              v.allocsize = uVar33;
              v.data = puVar20;
              v.data[sVar32] = (uchar)((uint)(0xffff - iVar71) >> 8);
              v.size = uVar29;
            }
            if (uVar23 < insize) {
              uVar33 = 0;
              do {
                sVar32 = v.size;
                uVar2 = in[uVar23];
                uVar29 = v.size + 1;
                puVar20 = v.data;
                uVar23 = v.allocsize;
                if (v.allocsize < uVar29) {
                  uVar23 = uVar29 * 3 >> 1;
                  if (v.allocsize * 2 < uVar29) {
                    uVar23 = uVar29;
                  }
                  puVar20 = (uchar *)realloc(v.data,uVar23);
                  if (puVar20 != (uchar *)0x0) goto LAB_0010f4f1;
                }
                else {
LAB_0010f4f1:
                  v.allocsize = uVar23;
                  v.data = puVar20;
                  v.data[sVar32] = uVar2;
                  v.size = uVar29;
                }
                uVar29 = uVar33 + 1;
              } while ((uVar33 < 0xfffe) &&
                      (uVar23 = (ulong)((int)uVar33 + iVar76 + 1), uVar33 = uVar29, uVar23 < insize)
                      );
              uVar23 = (ulong)(uint)(iVar76 + (int)uVar29);
            }
            uVar34 = uVar34 + 1;
          } while (uVar34 != uVar24);
          uVar13 = 0;
        }
        goto LAB_0011031b;
      }
      uVar24 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar24 = insize >> 3;
      }
      if (0x3fff7 < uVar24) {
        uVar24 = 0x3fff8;
      }
      sVar32 = uVar24 + 8;
    }
    local_140 = 1;
    if (!CARRY8(insize - 1,sVar32)) {
      local_140 = ((insize - 1) + sVar32) / sVar32;
    }
    uVar24 = (ulong)settings->windowsize;
    __s = (int *)malloc(0x40000);
    hash.head = __s;
    __s_00 = (int *)malloc(uVar24 * 4);
    __size = uVar24 * 2;
    hash.val = __s_00;
    puVar17 = (unsigned_short *)malloc(__size);
    hash.chain = puVar17;
    puVar18 = (unsigned_short *)malloc(__size);
    hash.zeros = puVar18;
    __s_01 = (int *)malloc(0x40c);
    hash.headz = __s_01;
    puVar19 = (unsigned_short *)malloc(__size);
    uVar13 = 0x53;
    hash.chainz = puVar19;
    if (__s_00 == (int *)0x0) {
      bVar39 = false;
    }
    else {
      bVar39 = false;
      if ((((__s != (int *)0x0) && (puVar17 != (unsigned_short *)0x0)) &&
          (bVar39 = false, puVar18 != (unsigned_short *)0x0)) &&
         ((__s_01 != (int *)0x0 && (puVar19 != (unsigned_short *)0x0)))) {
        memset(__s,0xff,0x40000);
        if (uVar24 == 0) {
          memset(__s_01,0xff,0x40c);
          uVar13 = 0;
          bVar39 = true;
        }
        else {
          memset(__s_00,0xff,uVar24 * 4);
          auVar9 = _DAT_0012a3b0;
          lVar31 = uVar24 - 1;
          auVar85._8_4_ = (int)lVar31;
          auVar85._0_8_ = lVar31;
          auVar85._12_4_ = (int)((ulong)lVar31 >> 0x20);
          uVar23 = 0;
          auVar85 = auVar85 ^ _DAT_0012a3b0;
          auVar53 = _DAT_0012a370;
          auVar79 = _DAT_0012a380;
          auVar83 = _DAT_0012a390;
          auVar57 = _DAT_0012a3a0;
          do {
            auVar44 = auVar57 ^ auVar9;
            iVar84 = auVar85._0_4_;
            iVar71 = -(uint)(iVar84 < auVar44._0_4_);
            iVar86 = auVar85._4_4_;
            auVar45._4_4_ = -(uint)(iVar86 < auVar44._4_4_);
            iVar87 = auVar85._8_4_;
            iVar76 = -(uint)(iVar87 < auVar44._8_4_);
            iVar88 = auVar85._12_4_;
            auVar45._12_4_ = -(uint)(iVar88 < auVar44._12_4_);
            auVar64._4_4_ = iVar71;
            auVar64._0_4_ = iVar71;
            auVar64._8_4_ = iVar76;
            auVar64._12_4_ = iVar76;
            auVar77 = pshuflw(in_XMM8,auVar64,0xe8);
            auVar47._4_4_ = -(uint)(auVar44._4_4_ == iVar86);
            auVar47._12_4_ = -(uint)(auVar44._12_4_ == iVar88);
            auVar47._0_4_ = auVar47._4_4_;
            auVar47._8_4_ = auVar47._12_4_;
            auVar82 = pshuflw(in_XMM9,auVar47,0xe8);
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar78 = pshuflw(auVar77,auVar45,0xe8);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar44 = (auVar78 | auVar82 & auVar77) ^ auVar44;
            auVar44 = packssdw(auVar44,auVar44);
            uVar22 = (unsigned_short)uVar23;
            if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar17[uVar23] = uVar22;
            }
            auVar45 = auVar47 & auVar64 | auVar45;
            auVar44 = packssdw(auVar45,auVar45);
            auVar78._8_4_ = 0xffffffff;
            auVar78._0_8_ = 0xffffffffffffffff;
            auVar78._12_4_ = 0xffffffff;
            auVar44 = packssdw(auVar44 ^ auVar78,auVar44 ^ auVar78);
            if ((auVar44._0_4_ >> 0x10 & 1) != 0) {
              puVar17[uVar23 + 1] = uVar22 + 1;
            }
            auVar44 = auVar83 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar44._0_4_);
            auVar72._4_4_ = -(uint)(iVar86 < auVar44._4_4_);
            iVar76 = -(uint)(iVar87 < auVar44._8_4_);
            auVar72._12_4_ = -(uint)(iVar88 < auVar44._12_4_);
            auVar46._4_4_ = iVar71;
            auVar46._0_4_ = iVar71;
            auVar46._8_4_ = iVar76;
            auVar46._12_4_ = iVar76;
            auVar63._4_4_ = -(uint)(auVar44._4_4_ == iVar86);
            auVar63._12_4_ = -(uint)(auVar44._12_4_ == iVar88);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar72._0_4_ = auVar72._4_4_;
            auVar72._8_4_ = auVar72._12_4_;
            auVar44 = auVar63 & auVar46 | auVar72;
            auVar44 = packssdw(auVar44,auVar44);
            auVar3._8_4_ = 0xffffffff;
            auVar3._0_8_ = 0xffffffffffffffff;
            auVar3._12_4_ = 0xffffffff;
            auVar44 = packssdw(auVar44 ^ auVar3,auVar44 ^ auVar3);
            if ((auVar44 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar17[uVar23 + 2] = uVar22 + 2;
            }
            auVar47 = pshufhw(auVar46,auVar46,0x84);
            auVar64 = pshufhw(auVar63,auVar63,0x84);
            auVar45 = pshufhw(auVar47,auVar72,0x84);
            auVar48._8_4_ = 0xffffffff;
            auVar48._0_8_ = 0xffffffffffffffff;
            auVar48._12_4_ = 0xffffffff;
            auVar48 = (auVar45 | auVar64 & auVar47) ^ auVar48;
            auVar47 = packssdw(auVar48,auVar48);
            if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar17[uVar23 + 3] = uVar22 + 3;
            }
            auVar47 = auVar79 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar47._0_4_);
            auVar50._4_4_ = -(uint)(iVar86 < auVar47._4_4_);
            iVar76 = -(uint)(iVar87 < auVar47._8_4_);
            auVar50._12_4_ = -(uint)(iVar88 < auVar47._12_4_);
            auVar65._4_4_ = iVar71;
            auVar65._0_4_ = iVar71;
            auVar65._8_4_ = iVar76;
            auVar65._12_4_ = iVar76;
            auVar44 = pshuflw(auVar44,auVar65,0xe8);
            auVar49._4_4_ = -(uint)(auVar47._4_4_ == iVar86);
            auVar49._12_4_ = -(uint)(auVar47._12_4_ == iVar88);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            in_XMM9 = pshuflw(auVar82 & auVar77,auVar49,0xe8);
            in_XMM9 = in_XMM9 & auVar44;
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar44 = pshuflw(auVar44,auVar50,0xe8);
            auVar77._8_4_ = 0xffffffff;
            auVar77._0_8_ = 0xffffffffffffffff;
            auVar77._12_4_ = 0xffffffff;
            auVar77 = (auVar44 | in_XMM9) ^ auVar77;
            auVar44 = packssdw(auVar77,auVar77);
            if ((auVar44 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar17[uVar23 + 4] = uVar22 + 4;
            }
            auVar50 = auVar49 & auVar65 | auVar50;
            auVar44 = packssdw(auVar50,auVar50);
            auVar82._8_4_ = 0xffffffff;
            auVar82._0_8_ = 0xffffffffffffffff;
            auVar82._12_4_ = 0xffffffff;
            auVar44 = packssdw(auVar44 ^ auVar82,auVar44 ^ auVar82);
            if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar17[uVar23 + 5] = uVar22 + 5;
            }
            auVar44 = auVar53 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar44._0_4_);
            auVar73._4_4_ = -(uint)(iVar86 < auVar44._4_4_);
            iVar76 = -(uint)(iVar87 < auVar44._8_4_);
            auVar73._12_4_ = -(uint)(iVar88 < auVar44._12_4_);
            auVar51._4_4_ = iVar71;
            auVar51._0_4_ = iVar71;
            auVar51._8_4_ = iVar76;
            auVar51._12_4_ = iVar76;
            auVar66._4_4_ = -(uint)(auVar44._4_4_ == iVar86);
            auVar66._12_4_ = -(uint)(auVar44._12_4_ == iVar88);
            auVar66._0_4_ = auVar66._4_4_;
            auVar66._8_4_ = auVar66._12_4_;
            auVar73._0_4_ = auVar73._4_4_;
            auVar73._8_4_ = auVar73._12_4_;
            auVar44 = auVar66 & auVar51 | auVar73;
            auVar44 = packssdw(auVar44,auVar44);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar44 ^ auVar4,auVar44 ^ auVar4);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar17[uVar23 + 6] = uVar22 + 6;
            }
            auVar44 = pshufhw(auVar51,auVar51,0x84);
            auVar45 = pshufhw(auVar66,auVar66,0x84);
            auVar47 = pshufhw(auVar44,auVar73,0x84);
            auVar52._8_4_ = 0xffffffff;
            auVar52._0_8_ = 0xffffffffffffffff;
            auVar52._12_4_ = 0xffffffff;
            auVar52 = (auVar47 | auVar45 & auVar44) ^ auVar52;
            auVar44 = packssdw(auVar52,auVar52);
            if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar17[uVar23 + 7] = uVar22 + 7;
            }
            uVar23 = uVar23 + 8;
            lVar31 = auVar57._8_8_;
            auVar57._0_8_ = auVar57._0_8_ + 8;
            auVar57._8_8_ = lVar31 + 8;
            lVar31 = auVar83._8_8_;
            auVar83._0_8_ = auVar83._0_8_ + 8;
            auVar83._8_8_ = lVar31 + 8;
            lVar31 = auVar79._8_8_;
            auVar79._0_8_ = auVar79._0_8_ + 8;
            auVar79._8_8_ = lVar31 + 8;
            lVar31 = auVar53._8_8_;
            auVar53._0_8_ = auVar53._0_8_ + 8;
            auVar53._8_8_ = lVar31 + 8;
          } while ((uVar24 + 7 & 0xfffffffffffffff8) != uVar23);
          memset(__s_01,0xff,0x40c);
          auVar9 = _DAT_0012a3b0;
          uVar23 = 0;
          auVar40 = _DAT_0012a370;
          auVar41 = _DAT_0012a380;
          auVar42 = _DAT_0012a390;
          auVar43 = _DAT_0012a3a0;
          do {
            auVar53 = auVar43 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar53._0_4_);
            auVar55._4_4_ = -(uint)(iVar86 < auVar53._4_4_);
            iVar76 = -(uint)(iVar87 < auVar53._8_4_);
            auVar55._12_4_ = -(uint)(iVar88 < auVar53._12_4_);
            auVar67._4_4_ = iVar71;
            auVar67._0_4_ = iVar71;
            auVar67._8_4_ = iVar76;
            auVar67._12_4_ = iVar76;
            auVar79 = pshuflw(in_XMM8,auVar67,0xe8);
            auVar54._4_4_ = -(uint)(auVar53._4_4_ == iVar86);
            auVar54._12_4_ = -(uint)(auVar53._12_4_ == iVar88);
            auVar54._0_4_ = auVar54._4_4_;
            auVar54._8_4_ = auVar54._12_4_;
            auVar83 = pshuflw(in_XMM9,auVar54,0xe8);
            auVar55._0_4_ = auVar55._4_4_;
            auVar55._8_4_ = auVar55._12_4_;
            auVar53 = pshuflw(auVar79,auVar55,0xe8);
            auVar80._8_4_ = 0xffffffff;
            auVar80._0_8_ = 0xffffffffffffffff;
            auVar80._12_4_ = 0xffffffff;
            auVar80 = (auVar53 | auVar83 & auVar79) ^ auVar80;
            auVar53 = packssdw(auVar80,auVar80);
            uVar22 = (unsigned_short)uVar23;
            if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar19[uVar23] = uVar22;
            }
            auVar55 = auVar54 & auVar67 | auVar55;
            auVar53 = packssdw(auVar55,auVar55);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar53 = packssdw(auVar53 ^ auVar5,auVar53 ^ auVar5);
            if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
              puVar19[uVar23 + 1] = uVar22 + 1;
            }
            auVar53 = auVar42 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar53._0_4_);
            auVar74._4_4_ = -(uint)(iVar86 < auVar53._4_4_);
            iVar76 = -(uint)(iVar87 < auVar53._8_4_);
            auVar74._12_4_ = -(uint)(iVar88 < auVar53._12_4_);
            auVar56._4_4_ = iVar71;
            auVar56._0_4_ = iVar71;
            auVar56._8_4_ = iVar76;
            auVar56._12_4_ = iVar76;
            auVar68._4_4_ = -(uint)(auVar53._4_4_ == iVar86);
            auVar68._12_4_ = -(uint)(auVar53._12_4_ == iVar88);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar74._0_4_ = auVar74._4_4_;
            auVar74._8_4_ = auVar74._12_4_;
            auVar53 = auVar68 & auVar56 | auVar74;
            auVar53 = packssdw(auVar53,auVar53);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar53 = packssdw(auVar53 ^ auVar6,auVar53 ^ auVar6);
            if ((auVar53 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar19[uVar23 + 2] = uVar22 + 2;
            }
            auVar57 = pshufhw(auVar56,auVar56,0x84);
            auVar44 = pshufhw(auVar68,auVar68,0x84);
            auVar85 = pshufhw(auVar57,auVar74,0x84);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar58 = (auVar85 | auVar44 & auVar57) ^ auVar58;
            auVar57 = packssdw(auVar58,auVar58);
            if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar19[uVar23 + 3] = uVar22 + 3;
            }
            auVar57 = auVar41 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar57._0_4_);
            auVar60._4_4_ = -(uint)(iVar86 < auVar57._4_4_);
            iVar76 = -(uint)(iVar87 < auVar57._8_4_);
            auVar60._12_4_ = -(uint)(iVar88 < auVar57._12_4_);
            auVar69._4_4_ = iVar71;
            auVar69._0_4_ = iVar71;
            auVar69._8_4_ = iVar76;
            auVar69._12_4_ = iVar76;
            auVar53 = pshuflw(auVar53,auVar69,0xe8);
            auVar59._4_4_ = -(uint)(auVar57._4_4_ == iVar86);
            auVar59._12_4_ = -(uint)(auVar57._12_4_ == iVar88);
            auVar59._0_4_ = auVar59._4_4_;
            auVar59._8_4_ = auVar59._12_4_;
            in_XMM9 = pshuflw(auVar83 & auVar79,auVar59,0xe8);
            in_XMM9 = in_XMM9 & auVar53;
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar53 = pshuflw(auVar53,auVar60,0xe8);
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            auVar81 = (auVar53 | in_XMM9) ^ auVar81;
            auVar53 = packssdw(auVar81,auVar81);
            if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              puVar19[uVar23 + 4] = uVar22 + 4;
            }
            auVar60 = auVar59 & auVar69 | auVar60;
            auVar53 = packssdw(auVar60,auVar60);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar53 = packssdw(auVar53 ^ auVar7,auVar53 ^ auVar7);
            if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              puVar19[uVar23 + 5] = uVar22 + 5;
            }
            auVar53 = auVar40 ^ auVar9;
            iVar71 = -(uint)(iVar84 < auVar53._0_4_);
            auVar75._4_4_ = -(uint)(iVar86 < auVar53._4_4_);
            iVar76 = -(uint)(iVar87 < auVar53._8_4_);
            auVar75._12_4_ = -(uint)(iVar88 < auVar53._12_4_);
            auVar61._4_4_ = iVar71;
            auVar61._0_4_ = iVar71;
            auVar61._8_4_ = iVar76;
            auVar61._12_4_ = iVar76;
            auVar70._4_4_ = -(uint)(auVar53._4_4_ == iVar86);
            auVar70._12_4_ = -(uint)(auVar53._12_4_ == iVar88);
            auVar70._0_4_ = auVar70._4_4_;
            auVar70._8_4_ = auVar70._12_4_;
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar53 = auVar70 & auVar61 | auVar75;
            auVar53 = packssdw(auVar53,auVar53);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar53 ^ auVar8,auVar53 ^ auVar8);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              puVar19[uVar23 + 6] = uVar22 + 6;
            }
            auVar53 = pshufhw(auVar61,auVar61,0x84);
            auVar83 = pshufhw(auVar70,auVar70,0x84);
            auVar79 = pshufhw(auVar53,auVar75,0x84);
            auVar62._8_4_ = 0xffffffff;
            auVar62._0_8_ = 0xffffffffffffffff;
            auVar62._12_4_ = 0xffffffff;
            auVar62 = (auVar79 | auVar83 & auVar53) ^ auVar62;
            auVar53 = packssdw(auVar62,auVar62);
            if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              puVar19[uVar23 + 7] = uVar22 + 7;
            }
            uVar23 = uVar23 + 8;
            lVar31 = auVar43._8_8_;
            auVar43._0_8_ = auVar43._0_8_ + 8;
            auVar43._8_8_ = lVar31 + 8;
            lVar31 = auVar42._8_8_;
            auVar42._0_8_ = auVar42._0_8_ + 8;
            auVar42._8_8_ = lVar31 + 8;
            lVar31 = auVar41._8_8_;
            auVar41._0_8_ = auVar41._0_8_ + 8;
            auVar41._8_8_ = lVar31 + 8;
            lVar31 = auVar40._8_8_;
            auVar40._0_8_ = auVar40._0_8_ + 8;
            auVar40._8_8_ = lVar31 + 8;
          } while ((uVar24 + 7 & 0x1fffffff8) != uVar23);
          uVar13 = 0;
          bVar39 = true;
        }
      }
    }
    if (bVar39) {
      if (local_140 == 0) {
        uVar13 = 0;
      }
      else {
        uVar24 = local_140 - 1;
        lVar31 = 0;
        uVar13 = 0;
        uVar33 = 0;
        uVar23 = local_140;
        uVar34 = sVar32;
        puVar20 = in;
        do {
          uVar29 = uVar34;
          if (insize < uVar34) {
            uVar29 = insize;
          }
          uVar30 = uVar33 * sVar32;
          uVar38 = uVar30 + sVar32;
          if (insize <= uVar30 + sVar32) {
            uVar38 = insize;
          }
          uVar36 = (uint)(uVar33 == uVar24);
          if (settings->btype == 2) {
            lz77_encoded.data = (uint *)0x0;
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            tree_cl.codes = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            tree_cl.table_len = (uchar *)0x0;
            tree_cl.table_value = (unsigned_short *)0x0;
            bitlen_lld.allocsize = 0;
            bitlen_lld.data = (uint *)0x0;
            bitlen_lld.size._0_4_ = 0;
            bitlen_lld.size._4_4_ = 0;
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            local_138.data = (uint *)0x0;
            local_138.size = 0;
            local_138.allocsize = 0;
            if (settings->use_lz77 == 0) {
              uVar13 = uivector_resize(&lz77_encoded,uVar38 - uVar30);
              if (uVar13 != 0) {
                if (uVar30 < uVar38) {
                  lVar37 = 0;
                  do {
                    lz77_encoded.data[lVar37] = (uint)puVar20[lVar37];
                    lVar37 = lVar37 + 1;
                  } while (uVar29 + lVar31 != lVar37);
                }
                goto LAB_0010f8f4;
              }
              uVar14 = 0x53;
LAB_0010fab8:
              puVar21 = (uint *)0x0;
LAB_0010fabb:
              frequencies = (undefined1 (*) [16])0x0;
              frequencies_00 = (undefined1 (*) [16])0x0;
              uVar13 = uVar14;
            }
            else {
              uVar14 = encodeLZ77(&lz77_encoded,&hash,in,uVar30,uVar38,settings->windowsize,
                                  settings->minmatch,settings->nicematch,settings->lazymatching);
              if (uVar14 != 0) goto LAB_0010fab8;
LAB_0010f8f4:
              puVar21 = (uint *)malloc(0x478);
              uVar14 = 0x53;
              if (puVar21 == (uint *)0x0) goto LAB_0010fabb;
              memset(puVar21,0,0x478);
              frequencies = (undefined1 (*) [16])malloc(0x78);
              if (frequencies == (undefined1 (*) [16])0x0) {
                frequencies_00 = (undefined1 (*) [16])0x0;
                uVar13 = uVar14;
              }
              else {
                frequencies[6] = (undefined1  [16])0x0;
                frequencies[5] = (undefined1  [16])0x0;
                frequencies[4] = (undefined1  [16])0x0;
                frequencies[3] = (undefined1  [16])0x0;
                frequencies[2] = (undefined1  [16])0x0;
                frequencies[1] = (undefined1  [16])0x0;
                *frequencies = (undefined1  [16])0x0;
                *(undefined8 *)frequencies[7] = 0;
                if (lz77_encoded.size != 0) {
                  sVar25 = 0;
                  do {
                    uVar13 = lz77_encoded.data[sVar25];
                    puVar21[uVar13] = puVar21[uVar13] + 1;
                    if (0x100 < (ulong)uVar13) {
                      *(int *)(*frequencies + (ulong)lz77_encoded.data[sVar25 + 2] * 4) =
                           *(int *)(*frequencies + (ulong)lz77_encoded.data[sVar25 + 2] * 4) + 1;
                      sVar25 = sVar25 + 3;
                    }
                    sVar25 = sVar25 + 1;
                  } while (sVar25 != lz77_encoded.size);
                }
                puVar21[0x100] = 1;
                uVar13 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar21,0x101,0x11e,0xf);
                if ((uVar13 == 0) &&
                   (uVar13 = HuffmanTree_makeFromFrequencies(&tree_d,(uint *)frequencies,2,0x1e,0xf)
                   , uVar16 = tree_d.numcodes, uVar13 == 0)) {
                  uVar23 = 0x11e;
                  if (tree_ll.numcodes < 0x11e) {
                    uVar23 = (ulong)tree_ll.numcodes;
                  }
                  uVar29 = 0x1e;
                  if (tree_d.numcodes < 0x1e) {
                    uVar29 = (ulong)tree_d.numcodes;
                  }
                  if (tree_ll.numcodes != 0) {
                    puVar10 = tree_ll.lengths;
                    uVar38 = 0;
                    do {
                      uVar13 = puVar10[uVar38];
                      uVar15 = uivector_resize(&bitlen_lld,
                                               CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size)
                                               + 1);
                      if (uVar15 != 0) {
                        bitlen_lld.data[CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size) + -1]
                             = uVar13;
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar23 != uVar38);
                  }
                  if (uVar16 != 0) {
                    puVar10 = tree_d.lengths;
                    uVar38 = 0;
                    do {
                      uVar13 = puVar10[uVar38];
                      uVar16 = uivector_resize(&bitlen_lld,
                                               CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size)
                                               + 1);
                      if (uVar16 != 0) {
                        bitlen_lld.data[CONCAT44(bitlen_lld.size._4_4_,(uint)bitlen_lld.size) + -1]
                             = uVar13;
                      }
                      uVar38 = uVar38 + 1;
                    } while (uVar29 != uVar38);
                  }
                  puVar10 = bitlen_lld.data;
                  uVar38 = (ulong)(uint)bitlen_lld.size;
                  if (uVar38 != 0) {
                    uVar30 = 0;
                    do {
                      uVar35 = uVar30 + 1;
                      uVar28 = 0;
                      if (uVar35 < uVar38) {
                        uVar28 = 0;
                        uVar26 = uVar35;
                        do {
                          if (puVar10[uVar26] != puVar10[uVar30]) break;
                          uVar28 = (ulong)((int)uVar28 + 1);
                          uVar26 = uVar35 + uVar28;
                        } while (uVar26 < uVar38);
                      }
                      uVar13 = puVar10[uVar30];
                      uVar16 = (uint)uVar28;
                      if ((uVar16 < 2) || (uVar13 != 0)) {
                        if (2 < uVar16) {
                          uVar15 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar15 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar13;
                          }
                          uVar35 = uVar28 / 6;
                          if (5 < uVar16) {
                            do {
                              uVar13 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar13 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                              }
                              uVar13 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                              if (uVar13 != 0) {
                                bitlen_lld_e.data[bitlen_lld_e.size - 1] = 3;
                              }
                              uVar35 = uVar35 - 1;
                            } while (uVar35 != 0);
                          }
                          uVar13 = uVar16 + (int)(uVar28 / 6) * -6;
                          if (uVar13 < 3) {
                            uVar28 = (ulong)(uVar16 - uVar13);
                          }
                          else {
                            uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar16 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x10;
                            }
                            uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                            if (uVar16 != 0) {
                              bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar13 - 3;
                            }
                          }
                          goto LAB_0010ff38;
                        }
                        uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                        if (uVar16 != 0) {
                          bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar13;
                        }
                      }
                      else {
                        uVar13 = uVar16 + 1;
                        if (uVar13 < 0xb) {
                          uVar13 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar13 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x11;
                          }
                          uVar13 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar13 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar16 - 2;
                          }
                        }
                        else {
                          if (0x89 < uVar13) {
                            uVar13 = 0x8a;
                          }
                          uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar16 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = 0x12;
                          }
                          uVar16 = uivector_resize(&bitlen_lld_e,bitlen_lld_e.size + 1);
                          if (uVar16 != 0) {
                            bitlen_lld_e.data[bitlen_lld_e.size - 1] = uVar13 - 0xb;
                          }
                          uVar28 = (ulong)(uVar13 - 1);
                        }
LAB_0010ff38:
                        uVar30 = uVar30 + uVar28;
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar30 != uVar38);
                  }
                  frequencies_00 = (undefined1 (*) [16])malloc(0x4c);
                  sVar25 = bitlen_lld_e.size;
                  uVar13 = uVar14;
                  if (frequencies_00 != (undefined1 (*) [16])0x0) {
                    *(undefined1 (*) [16])(frequencies_00[3] + 0xc) = (undefined1  [16])0x0;
                    frequencies_00[3] = (undefined1  [16])0x0;
                    frequencies_00[2] = (undefined1  [16])0x0;
                    frequencies_00[1] = (undefined1  [16])0x0;
                    *frequencies_00 = (undefined1  [16])0x0;
                    if (bitlen_lld_e.size != 0) {
                      sVar27 = 0;
                      do {
                        uVar13 = bitlen_lld_e.data[sVar27];
                        *(int *)(*frequencies_00 + (ulong)uVar13 * 4) =
                             *(int *)(*frequencies_00 + (ulong)uVar13 * 4) + 1;
                        sVar27 = (sVar27 - ((ulong)uVar13 < 0x10)) + 2;
                      } while (sVar27 != bitlen_lld_e.size);
                    }
                    uVar13 = HuffmanTree_makeFromFrequencies
                                       (&tree_cl,(uint *)frequencies_00,0x13,0x13,7);
                    if (uVar13 == 0) {
                      uVar38 = (ulong)tree_cl.numcodes;
                      uVar16 = uivector_resize(&local_138,uVar38);
                      uVar13 = uVar14;
                      if (uVar16 != 0) {
                        if (uVar38 != 0) {
                          lVar37 = 0;
                          do {
                            *(uint *)((long)local_138.data + lVar37) =
                                 tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar37)];
                            lVar37 = lVar37 + 4;
                          } while (uVar38 << 2 != lVar37);
                        }
                        do {
                          uVar14 = local_138.data[local_138.size - 1];
                          bVar39 = local_138.size < 5;
                          if (bVar39 || uVar14 != 0) {
                            uVar13 = 0;
                            goto LAB_00110097;
                          }
                          uVar13 = uivector_resize(&local_138,local_138.size - 1);
                        } while (uVar13 != 0);
                        uVar13 = 0x53;
LAB_00110097:
                        if (bVar39 || uVar14 != 0) {
                          writeBits(&local_150,uVar36,1);
                          writeBits(&local_150,0,1);
                          writeBits(&local_150,1,1);
                          puVar10 = local_138.data;
                          iVar71 = (int)local_138.size;
                          uVar30 = (ulong)(iVar71 - 4) + 3;
                          uVar38 = 0;
                          do {
                            uVar35 = uVar38;
                            if (uVar35 == iVar71 - 4) break;
                            uVar28 = uVar30 & 0xffffffff;
                            uVar30 = uVar30 - 1;
                            uVar38 = uVar35 + 1;
                          } while (local_138.data[uVar28] == 0);
                          iVar76 = (int)(uVar35 + 1);
                          writeBits(&local_150,(int)uVar23 - 0x101,5);
                          writeBits(&local_150,(int)uVar29 - 1,5);
                          writeBits(&local_150,(iVar71 - iVar76) - 3,4);
                          if (iVar71 + 1 != iVar76) {
                            uVar23 = 0;
                            do {
                              writeBits(&local_150,puVar10[uVar23],3);
                              uVar23 = uVar23 + 1;
                            } while ((uint)(iVar71 - (int)uVar35) != uVar23);
                          }
                          puVar12 = tree_cl.lengths;
                          puVar11 = tree_cl.codes;
                          puVar10 = bitlen_lld_e.data;
                          if (sVar25 != 0) {
                            sVar27 = 0;
                            do {
                              writeBitsReversed(&local_150,puVar11[puVar10[sVar27]],
                                                (ulong)puVar12[puVar10[sVar27]]);
                              puVar1 = puVar10 + sVar27;
                              if (*puVar1 - 0x10 < 3) {
                                lVar37 = sVar27 + 1;
                                sVar27 = sVar27 + 1;
                                writeBits(&local_150,puVar10[lVar37],
                                          *(size_t *)(&DAT_0012ae70 + (ulong)(*puVar1 - 0x10) * 8));
                              }
                              sVar27 = sVar27 + 1;
                            } while (sVar27 != sVar25);
                          }
                          writeLZ77data(&local_150,&lz77_encoded,&tree_ll,&tree_d);
                          if ((ulong)tree_ll.lengths[0x100] == 0) {
                            uVar13 = 0x40;
                          }
                          else {
                            writeBitsReversed(&local_150,tree_ll.codes[0x100],
                                              (ulong)tree_ll.lengths[0x100]);
                            uVar13 = 0;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  frequencies_00 = (undefined1 (*) [16])0x0;
                }
              }
            }
            lz77_encoded.size = 0;
            lz77_encoded.allocsize = 0;
            free(lz77_encoded.data);
            lz77_encoded.data = (uint *)0x0;
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            HuffmanTree_cleanup(&tree_cl);
            free(puVar21);
            free(frequencies);
            free(frequencies_00);
            bitlen_lld_e.size = 0;
            bitlen_lld_e.allocsize = 0;
            free(bitlen_lld_e.data);
            bitlen_lld_e.data = (uint *)0x0;
            bitlen_lld.size._0_4_ = 0;
            bitlen_lld.size._4_4_ = 0;
            bitlen_lld.allocsize = 0;
            free(bitlen_lld.data);
            bitlen_lld.data = (uint *)0x0;
            local_138.size = 0;
            local_138.allocsize = 0;
            free(local_138.data);
            uVar23 = local_140;
          }
          else if (settings->btype == 1) {
            tree_ll.codes = (uint *)0x0;
            tree_ll.lengths = (uint *)0x0;
            tree_ll.table_len = (uchar *)0x0;
            tree_ll.table_value = (unsigned_short *)0x0;
            tree_d.codes = (uint *)0x0;
            tree_d.lengths = (uint *)0x0;
            tree_d.table_len = (uchar *)0x0;
            tree_d.table_value = (unsigned_short *)0x0;
            generateFixedLitLenTree(&tree_ll);
            generateFixedDistanceTree(&tree_d);
            writeBits(&local_150,uVar36,1);
            writeBits(&local_150,1,1);
            writeBits(&local_150,0,1);
            if (settings->use_lz77 == 0) {
              uVar13 = 0;
              if (uVar30 < uVar38) {
                puVar21 = tree_ll.codes;
                puVar10 = tree_ll.lengths;
                lVar37 = 0;
                do {
                  writeBitsReversed(&local_150,puVar21[puVar20[lVar37]],
                                    (ulong)puVar10[puVar20[lVar37]]);
                  lVar37 = lVar37 + 1;
                } while (uVar29 + lVar31 != lVar37);
                uVar13 = 0;
              }
            }
            else {
              tree_cl.codes = (uint *)0x0;
              tree_cl.lengths = (uint *)0x0;
              tree_cl.maxbitlen = 0;
              tree_cl.numcodes = 0;
              uVar13 = encodeLZ77((uivector *)&tree_cl,&hash,in,uVar30,uVar38,settings->windowsize,
                                  settings->minmatch,settings->nicematch,settings->lazymatching);
              if (uVar13 == 0) {
                writeLZ77data(&local_150,(uivector *)&tree_cl,&tree_ll,&tree_d);
              }
              tree_cl.lengths = (uint *)0x0;
              tree_cl.maxbitlen = 0;
              tree_cl.numcodes = 0;
              free(tree_cl.codes);
            }
            if (uVar13 == 0) {
              writeBitsReversed(&local_150,tree_ll.codes[0x100],(ulong)tree_ll.lengths[0x100]);
            }
            HuffmanTree_cleanup(&tree_ll);
            HuffmanTree_cleanup(&tree_d);
            uVar23 = local_140;
          }
          uVar33 = uVar33 + 1;
          if (uVar33 == uVar23) break;
          uVar34 = uVar34 + sVar32;
          lVar31 = lVar31 - sVar32;
          puVar20 = puVar20 + sVar32;
        } while (uVar13 == 0);
      }
      free(hash.head);
      free(hash.val);
      free(hash.chain);
      free(hash.zeros);
      free(hash.headz);
      free(hash.chainz);
    }
  }
LAB_0011031b:
  *out = v.data;
  *outsize = v.size;
  return uVar13;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}